

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

string * __thiscall
cmFileWatcher::Path_abi_cxx11_(string *__return_storage_ptr__,cmFileWatcher *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmFileWatcher *local_18;
  cmFileWatcher *this_local;
  
  local_18 = this;
  this_local = (cmFileWatcher *)__return_storage_ptr__;
  (*(this->Parent->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher[3])();
  std::operator+(__return_storage_ptr__,&local_38,&this->PathSegment);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string Path() const final
  {
    return this->Parent->Path() + this->PathSegment;
  }